

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

Header * __thiscall Imf_3_4::Header::operator=(Header *this,Header *other)

{
  bool bVar1;
  pointer ppVar2;
  pointer this_00;
  Header *in_RSI;
  Header *in_RDI;
  const_iterator i_1;
  iterator i;
  Header *in_stack_00000048;
  Header *in_stack_00000050;
  Attribute *in_stack_000005a0;
  char *in_stack_000005a8;
  Header *in_stack_000005b0;
  map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
  *in_stack_ffffffffffffffb8;
  _Rb_tree_iterator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>
  *in_stack_ffffffffffffffc0;
  _Self local_30;
  _Self local_28;
  _Self local_20;
  _Self local_18;
  Header *local_10;
  
  if (in_RDI != in_RSI) {
    local_10 = in_RSI;
    local_18._M_node =
         (_Base_ptr)
         std::
         map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
         ::begin(in_stack_ffffffffffffffb8);
    while( true ) {
      local_20._M_node =
           (_Base_ptr)
           std::
           map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
           ::end(in_stack_ffffffffffffffb8);
      bVar1 = std::operator!=(&local_18,&local_20);
      if (!bVar1) break;
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>::
               operator->((_Rb_tree_iterator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>
                           *)0x1d7340);
      in_stack_ffffffffffffffc0 =
           (_Rb_tree_iterator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_> *)
           ppVar2->second;
      if (in_stack_ffffffffffffffc0 !=
          (_Rb_tree_iterator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_> *)0x0) {
        (*(code *)in_stack_ffffffffffffffc0->_M_node->_M_parent)();
      }
      std::_Rb_tree_iterator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>::operator++
                (in_stack_ffffffffffffffc0);
    }
    std::
    map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
    ::clear((map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
             *)0x1d7375);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
         ::begin(in_stack_ffffffffffffffb8);
    while( true ) {
      local_30._M_node =
           (_Base_ptr)
           std::
           map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
           ::end(in_stack_ffffffffffffffb8);
      bVar1 = std::operator!=(&local_28,&local_30);
      if (!bVar1) break;
      this_00 = std::_Rb_tree_const_iterator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>
                ::operator->((_Rb_tree_const_iterator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>
                              *)in_stack_ffffffffffffffc0);
      in_stack_ffffffffffffffb8 =
           (map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
            *)Name::operator*(&this_00->first);
      std::_Rb_tree_const_iterator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>::
      operator->((_Rb_tree_const_iterator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_> *)
                 in_stack_ffffffffffffffc0);
      insert(in_stack_000005b0,in_stack_000005a8,in_stack_000005a0);
      std::_Rb_tree_const_iterator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>::
      operator++((_Rb_tree_const_iterator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_> *)
                 in_stack_ffffffffffffffc0);
    }
    anon_unknown_1::copyCompressionRecord(in_stack_00000050,in_stack_00000048);
    in_RDI->_readsNothing = (bool)(local_10->_readsNothing & 1);
  }
  return in_RDI;
}

Assistant:

Header&
Header::operator= (const Header& other)
{
    if (this != &other)
    {
        for (AttributeMap::iterator i = _map.begin (); i != _map.end (); ++i)
        {
            delete i->second;
        }

        _map.clear ();

        for (AttributeMap::const_iterator i = other._map.begin ();
             i != other._map.end ();
             ++i)
        {
            insert (*i->first, *i->second);
        }
        copyCompressionRecord (this, &other);
        _readsNothing = other._readsNothing;
    }

    return *this;
}